

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipoint-counter.cpp
# Opt level: O2

void __thiscall mahjong::MinipointCounter::computePair(MinipointCounter *this)

{
  vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> *pvVar1;
  bool bVar2;
  Tile TVar3;
  vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> *__x;
  Pair it;
  _Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_> _Stack_38;
  
  __x = &((this->hand->pairs).super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
          _M_impl.super__Vector_impl_data._M_start)->tiles;
  pvVar1 = &((this->hand->pairs).super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
             _M_impl.super__Vector_impl_data._M_finish)->tiles;
  do {
    if (__x == pvVar1) {
      return;
    }
    std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::vector
              ((vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> *)&_Stack_38,__x);
    bVar2 = Pair::isDragons((Pair *)&_Stack_38);
    if (bVar2) {
LAB_001939eb:
      this->point = this->point + 2;
    }
    else {
      TVar3 = WiningState::seatWind(this->state);
      bVar2 = Pair::isContain((Pair *)&_Stack_38,TVar3);
      if (bVar2) {
        this->point = this->point + 2;
      }
      TVar3 = WiningState::roundWind(this->state);
      bVar2 = Pair::isContain((Pair *)&_Stack_38,TVar3);
      if (bVar2) goto LAB_001939eb;
    }
    std::_Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>::~_Vector_base(&_Stack_38);
    __x = __x + 1;
  } while( true );
}

Assistant:

void MinipointCounter::computePair()
{
	for (auto it : hand.pairs)
	{
		if (it.isDragons())
		{
			point += 2;
		}
		else
		{
			if (it.isContain(state.seatWind()))
			{
				point += 2;
			}

			if (it.isContain(state.roundWind()))
			{
				point += 2;
			}
		}
	}
}